

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

void __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>>
::
ReadBounds<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>>::AlgebraicConHandler>
          (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>>
           *this)

{
  char *pcVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  BinaryReaderBase *this_00;
  ArgList local_58;
  ulong local_48 [3];
  
  iVar3 = *(int *)(*(long *)(this + 8) + 4);
  if (0 < iVar3) {
    do {
      this_00 = *(BinaryReaderBase **)this;
      pcVar1 = (this_00->super_ReaderBase).ptr_;
      (this_00->super_ReaderBase).token_ = pcVar1;
      pcVar4 = pcVar1 + 1;
      (this_00->super_ReaderBase).ptr_ = pcVar4;
      switch(*pcVar1) {
      case '0':
        (this_00->super_ReaderBase).token_ = pcVar4;
        BinaryReaderBase::Read(this_00,8);
        this_00 = *(BinaryReaderBase **)this;
        pcVar4 = (this_00->super_ReaderBase).ptr_;
      case '1':
      case '2':
      case '4':
        (this_00->super_ReaderBase).token_ = pcVar4;
        BinaryReaderBase::Read(this_00,8);
        break;
      case '3':
        break;
      case '5':
        (this_00->super_ReaderBase).token_ = pcVar4;
        BinaryReaderBase::Read(this_00,4);
        uVar2 = BinaryReader<mp::internal::IdentityConverter>::ReadUInt
                          (*(BinaryReader<mp::internal::IdentityConverter> **)this);
        if ((uVar2 == 0) || (**(int **)(this + 8) < (int)uVar2)) {
          this_00 = *(BinaryReaderBase **)this;
          local_48[0] = (ulong)uVar2;
          local_58.types_ = 2;
          pcVar4 = "integer {} out of bounds";
          goto LAB_001594af;
        }
        break;
      default:
        local_48[0] = 0;
        local_48[1] = 0;
        local_58.types_ = 0;
        pcVar4 = "expected bound";
LAB_001594af:
        local_58.field_1.values_ = (Value *)local_48;
        BinaryReaderBase::ReportError(this_00,(CStringRef)pcVar4,&local_58);
      }
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  return;
}

Assistant:

int num_items() const { return this->reader_.header_.num_algebraic_cons; }